

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O1

void xrep0_sock_init(void *arg,nni_sock *sock)

{
  nni_msgq *pnVar1;
  
  nni_mtx_init((nni_mtx *)((long)arg + 0x10));
  nni_aio_init((nni_aio *)((long)arg + 0x78),xrep0_sock_getq_cb,arg);
  nni_atomic_init((nni_atomic_int *)((long)arg + 0x38));
  nni_atomic_set((nni_atomic_int *)((long)arg + 0x38),8);
  pnVar1 = nni_sock_sendq(sock);
  *(nni_msgq **)arg = pnVar1;
  pnVar1 = nni_sock_recvq(sock);
  *(nni_msgq **)((long)arg + 8) = pnVar1;
  nni_id_map_init((nni_id_map *)((long)arg + 0x40),0,0,false);
  return;
}

Assistant:

static void
xrep0_sock_init(void *arg, nni_sock *sock)
{
	xrep0_sock *s = arg;

	nni_mtx_init(&s->lk);
	nni_aio_init(&s->aio_getq, xrep0_sock_getq_cb, s);
	nni_atomic_init(&s->ttl);
	nni_atomic_set(&s->ttl, 8); // Per RFC
	s->uwq = nni_sock_sendq(sock);
	s->urq = nni_sock_recvq(sock);

	nni_id_map_init(&s->pipes, 0, 0, false);
}